

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixEnv::Schedule
          (PosixEnv *this,_func_void_void_ptr *background_work_function,void *background_work_arg)

{
  bool bVar1;
  PosixEnv *local_30;
  thread local_28;
  thread background_thread;
  void *background_work_arg_local;
  _func_void_void_ptr *background_work_function_local;
  PosixEnv *this_local;
  
  background_thread._M_id._M_thread = (id)(id)background_work_arg;
  background_work_arg_local = background_work_function;
  background_work_function_local = (_func_void_void_ptr *)this;
  port::Mutex::Lock(&this->background_work_mutex_);
  if ((this->started_background_thread_ & 1U) == 0) {
    this->started_background_thread_ = true;
    local_30 = this;
    std::thread::
    thread<void(&)(leveldb::(anonymous_namespace)::PosixEnv*),leveldb::(anonymous_namespace)::PosixEnv*,void>
              (&local_28,BackgroundThreadEntryPoint,&local_30);
    std::thread::detach();
    std::thread::~thread(&local_28);
  }
  bVar1 = std::
          queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
          ::empty(&this->background_work_queue_);
  if (bVar1) {
    port::CondVar::Signal(&this->background_work_cv_);
  }
  std::
  queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>>>
  ::emplace<void(*&)(void*),void*&>
            ((queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>>>
              *)&this->background_work_queue_,(_func_void_void_ptr **)&background_work_arg_local,
             (void **)&background_thread);
  port::Mutex::Unlock(&this->background_work_mutex_);
  return;
}

Assistant:

void PosixEnv::Schedule(
    void (*background_work_function)(void* background_work_arg),
    void* background_work_arg) {
  background_work_mutex_.Lock();

  // Start the background thread, if we haven't done so already.
  if (!started_background_thread_) {
    started_background_thread_ = true;
    std::thread background_thread(PosixEnv::BackgroundThreadEntryPoint, this);
    background_thread.detach();
  }

  // If the queue is empty, the background thread may be waiting for work.
  if (background_work_queue_.empty()) {
    background_work_cv_.Signal();
  }

  background_work_queue_.emplace(background_work_function, background_work_arg);
  background_work_mutex_.Unlock();
}